

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

shared_ptr<const_std::valarray<float>_> __thiscall
notch::core::FullyConnectedLayer::getWeights(FullyConnectedLayer *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<const_std::valarray<float>_> sVar1;
  
  ::std::__shared_ptr<std::valarray<float>const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::valarray<float>,void>
            ((__shared_ptr<std::valarray<float>const,(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2> *)(in_RSI + 0x38));
  sVar1.super___shared_ptr<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_std::valarray<float>_>)
         sVar1.super___shared_ptr<const_std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<const Array> getWeights() const {
        return weights;
    }